

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall FxMinusSign::FxMinusSign(FxMinusSign *this,FxExpression *operand)

{
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
  FScriptPosition::FScriptPosition
            (&(this->super_FxExpression).ScriptPosition,&operand->ScriptPosition);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_MinusSign;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxMinusSign_0070b8f0;
  this->Operand = operand;
  return;
}

Assistant:

FxMinusSign::FxMinusSign(FxExpression *operand)
: FxExpression(EFX_MinusSign, operand->ScriptPosition)
{
	Operand=operand;
}